

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_exp.c
# Opt level: O0

int BN_mod_exp_mont_consttime_x2
              (BIGNUM *rr1,BIGNUM *a1,BIGNUM *p1,BIGNUM *m1,BN_MONT_CTX *in_mont1,BIGNUM *rr2,
              BIGNUM *a2,BIGNUM *p2,BIGNUM *m2,BN_MONT_CTX *in_mont2,BN_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  BIGNUM *pBVar3;
  BIGNUM *in_RCX;
  BIGNUM *in_RDX;
  BIGNUM *in_RSI;
  BIGNUM *in_RDI;
  BN_MONT_CTX *in_R8;
  BIGNUM *in_R9;
  unsigned_long unaff_R15;
  unsigned_long *unaff_retaddr;
  BIGNUM *in_stack_00000008;
  BIGNUM *in_stack_00000010;
  BIGNUM *in_stack_00000018;
  BN_MONT_CTX *in_stack_00000020;
  BN_CTX *in_stack_00000028;
  unsigned_long *in_stack_00000030;
  BN_MONT_CTX *mont2;
  BN_MONT_CTX *mont1;
  unsigned_long *in_stack_00000048;
  int ret;
  undefined8 in_stack_ffffffffffffff68;
  int words;
  BIGNUM *in_stack_ffffffffffffff70;
  BN_MONT_CTX *local_60;
  BN_MONT_CTX *local_58;
  uint local_4c;
  
  words = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_4c = 0;
  local_58 = (BN_MONT_CTX *)0x0;
  local_60 = (BN_MONT_CTX *)0x0;
  iVar1 = ossl_rsaz_avx512ifma_eligible();
  if (((((iVar1 == 0) || (in_RSI->top != 0x10)) || (in_RDX->top != 0x10)) ||
      ((iVar1 = BN_num_bits(in_RCX), iVar1 != 0x400 || (in_stack_00000008->top != 0x10)))) ||
     ((in_stack_00000010->top != 0x10 || (iVar1 = BN_num_bits(in_stack_00000018), iVar1 != 0x400))))
  {
    uVar2 = BN_mod_exp_mont_consttime((BIGNUM *)in_RDI,in_RSI,in_RDX,in_RCX,in_stack_00000028,in_R8)
    ;
    local_4c = BN_mod_exp_mont_consttime
                         ((BIGNUM *)in_R9,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                          in_stack_00000028,in_stack_00000020);
    local_4c = local_4c & uVar2;
  }
  else {
    pBVar3 = bn_wexpand(in_stack_ffffffffffffff70,words);
    if (((pBVar3 != (BIGNUM *)0x0) &&
        (pBVar3 = bn_wexpand(in_stack_ffffffffffffff70,words), pBVar3 != (BIGNUM *)0x0)) &&
       ((local_58 = in_R8, in_R8 != (BN_MONT_CTX *)0x0 ||
        ((local_58 = BN_MONT_CTX_new(), local_58 != (BN_MONT_CTX *)0x0 &&
         (iVar1 = BN_MONT_CTX_set(local_58,in_RCX,in_stack_00000028), iVar1 != 0)))))) {
      if (in_stack_00000020 == (BN_MONT_CTX *)0x0) {
        local_60 = BN_MONT_CTX_new();
        if ((local_60 == (BN_MONT_CTX *)0x0) ||
           (iVar1 = BN_MONT_CTX_set(local_60,in_stack_00000018,in_stack_00000028), iVar1 == 0))
        goto LAB_00224373;
      }
      else {
        local_60 = in_stack_00000020;
      }
      local_4c = ossl_rsaz_mod_exp_avx512_x2
                           ((unsigned_long *)in_stack_00000020,(unsigned_long *)in_stack_00000018,
                            (unsigned_long *)in_stack_00000010,(unsigned_long *)in_stack_00000008,
                            unaff_retaddr,unaff_R15,in_stack_00000030,(unsigned_long *)mont2,
                            (unsigned_long *)mont1,in_stack_00000048,(unsigned_long *)rr2,
                            (unsigned_long)in_mont1,(int)m1);
      in_RDI->top = 0x10;
      in_RDI->neg = 0;
      bn_correct_top(in_RDI);
      in_R9->top = 0x10;
      in_R9->neg = 0;
      bn_correct_top(in_R9);
    }
  }
LAB_00224373:
  if (in_stack_00000020 == (BN_MONT_CTX *)0x0) {
    BN_MONT_CTX_free(local_60);
  }
  if (in_R8 == (BN_MONT_CTX *)0x0) {
    BN_MONT_CTX_free(local_58);
  }
  return local_4c;
}

Assistant:

int BN_mod_exp_mont_consttime_x2(BIGNUM *rr1, const BIGNUM *a1, const BIGNUM *p1,
                                 const BIGNUM *m1, BN_MONT_CTX *in_mont1,
                                 BIGNUM *rr2, const BIGNUM *a2, const BIGNUM *p2,
                                 const BIGNUM *m2, BN_MONT_CTX *in_mont2,
                                 BN_CTX *ctx)
{
    int ret = 0;

#ifdef RSAZ_ENABLED
    BN_MONT_CTX *mont1 = NULL;
    BN_MONT_CTX *mont2 = NULL;

    if (ossl_rsaz_avx512ifma_eligible() &&
        ((a1->top == 16) && (p1->top == 16) && (BN_num_bits(m1) == 1024) &&
         (a2->top == 16) && (p2->top == 16) && (BN_num_bits(m2) == 1024))) {

        if (bn_wexpand(rr1, 16) == NULL)
            goto err;
        if (bn_wexpand(rr2, 16) == NULL)
            goto err;

        /*  Ensure that montgomery contexts are initialized */
        if (in_mont1 != NULL) {
            mont1 = in_mont1;
        } else {
            if ((mont1 = BN_MONT_CTX_new()) == NULL)
                goto err;
            if (!BN_MONT_CTX_set(mont1, m1, ctx))
                goto err;
        }
        if (in_mont2 != NULL) {
            mont2 = in_mont2;
        } else {
            if ((mont2 = BN_MONT_CTX_new()) == NULL)
                goto err;
            if (!BN_MONT_CTX_set(mont2, m2, ctx))
                goto err;
        }

        ret = ossl_rsaz_mod_exp_avx512_x2(rr1->d, a1->d, p1->d, m1->d,
                                          mont1->RR.d, mont1->n0[0],
                                          rr2->d, a2->d, p2->d, m2->d,
                                          mont2->RR.d, mont2->n0[0],
                                          1024 /* factor bit size */);

        rr1->top = 16;
        rr1->neg = 0;
        bn_correct_top(rr1);
        bn_check_top(rr1);

        rr2->top = 16;
        rr2->neg = 0;
        bn_correct_top(rr2);
        bn_check_top(rr2);

        goto err;
    }
#endif

    /* rr1 = a1^p1 mod m1 */
    ret = BN_mod_exp_mont_consttime(rr1, a1, p1, m1, ctx, in_mont1);
    /* rr2 = a2^p2 mod m2 */
    ret &= BN_mod_exp_mont_consttime(rr2, a2, p2, m2, ctx, in_mont2);

#ifdef RSAZ_ENABLED
err:
    if (in_mont2 == NULL)
        BN_MONT_CTX_free(mont2);
    if (in_mont1 == NULL)
        BN_MONT_CTX_free(mont1);
#endif

    return ret;
}